

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_16.cpp
# Opt level: O0

int main(void)

{
  exception *e;
  vector<double,_std::allocator<double>_> numbers;
  string local_30 [8];
  string in;
  
  prompt_filename_abi_cxx11_((FileType *)local_30);
  read_numbers((vector<double,_std::allocator<double>_> *)&e,local_30);
  print_numbers((vector<double,_std::allocator<double>_> *)&e);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&e);
  std::__cxx11::string::~string((string *)local_30);
  return 0;
}

Assistant:

int main()
{
	try
	{
		auto in = prompt_filename(FileType::in);
		auto numbers = read_numbers(in);
		print_numbers(numbers);
	}
	catch (const std::exception& e)
	{
		std::cerr << e.what() << '\n';
		return -1;
	}
	catch (...)
	{
		std::cerr << "Unknown exception occured.\n";
		return -2;
	}
}